

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

unsigned_long fs_libcxx_release(void)

{
  return 0xb;
}

Assistant:

unsigned long fs_libcxx_release()
{
#if defined(_LIBCPP_VERSION)  // LLVM libc++
  return _LIBCPP_VERSION;
#elif defined(_GLIBCXX_RELEASE)  // GNU libstdc++
  return _GLIBCXX_RELEASE;
#elif defined(_MSVC_STL_UPDATE)  // Microsoft STL
  return _MSVC_STL_UPDATE;
#else
  return 0;
#endif
}